

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O3

int VmJsonObjectEncode(jx9_value *pKey,jx9_value *pValue,void *pUserData)

{
  undefined8 in_RAX;
  char *pcVar1;
  sxu32 nSize;
  json_private_data *pJson;
  SyBlob *pBlob;
  int nByte;
  sxu32 local_24;
  
  local_24 = (sxu32)((ulong)in_RAX >> 0x20);
  if (*(int *)((long)pUserData + 0x10) < 0x20) {
    if (*(int *)((long)pUserData + 8) == 0) {
      SyBlobAppend(*pUserData,",",1);
    }
    pcVar1 = jx9_value_to_string(pKey,(int *)&local_24);
    pBlob = *pUserData;
    if ((int)local_24 < 1) {
      pcVar1 = "null";
      nSize = 4;
    }
    else {
      SyBlobAppend(pBlob,"\"",1);
      SyBlobAppend(*pUserData,pcVar1,local_24);
      pBlob = *pUserData;
      pcVar1 = "\"";
      nSize = 1;
    }
    SyBlobAppend(pBlob,pcVar1,nSize);
    SyBlobAppend(*pUserData,":",1);
    *(int *)((long)pUserData + 0x10) = *(int *)((long)pUserData + 0x10) + 1;
    VmJsonEncode(pValue,(json_private_data *)pUserData);
    *(int *)((long)pUserData + 0x10) = *(int *)((long)pUserData + 0x10) + -1;
    *(undefined4 *)((long)pUserData + 8) = 0;
  }
  return 0;
}

Assistant:

static int VmJsonObjectEncode(jx9_value *pKey,jx9_value *pValue,void *pUserData)
{
	json_private_data *pJson = (json_private_data *)pUserData;
	const char *zKey;
	int nByte;
	if( pJson->nRecCount > 31 ){
		/* Recursion limit reached, return immediately */
		return JX9_OK;
	}
	if( !pJson->isFirst ){
		/* Append the colon first */
		SyBlobAppend(pJson->pOut,",",sizeof(char));
	}
	/* Extract a string representation of the key */
	zKey = jx9_value_to_string(pKey, &nByte);
	/* Append the key and the double colon */
	if( nByte > 0 ){
		SyBlobAppend(pJson->pOut,"\"",sizeof(char));
		SyBlobAppend(pJson->pOut,zKey,(sxu32)nByte);
		SyBlobAppend(pJson->pOut,"\"",sizeof(char));
	}else{
		/* Can't happen */
		SyBlobAppend(pJson->pOut,"null",sizeof("null")-1);
	}
	SyBlobAppend(pJson->pOut,":",sizeof(char));
	/* Encode the value */
	pJson->nRecCount++;
	VmJsonEncode(pValue, pJson);
	pJson->nRecCount--;
	pJson->isFirst = 0;
	return JX9_OK;
}